

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void dumpBool1(uint8_t value,bool inArray)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 in_SIL;
  undefined1 in_DIL;
  char local_2;
  byte local_1;
  
  uVar1 = (ulong)CONCAT11(in_DIL,in_SIL) & 0xff01;
  local_1 = (byte)(uVar1 >> 8);
  local_2 = (char)uVar1;
  pcVar2 = "";
  if (local_2 != '\0') {
    pcVar2 = " ";
  }
  printf("%02hhx                      %s",(ulong)local_1,pcVar2);
  if (local_1 == 0) {
    printf("FALSE");
  }
  else if (local_1 == 1) {
    printf("TRUE");
  }
  else {
    printf("(invalid) TRUE");
  }
  return;
}

Assistant:

void dumpBool1(uint8_t value, bool inArray = false)
{
	printf("%02hhx                      %s", value, inArray ? " " : "");
	switch (value)
	{
	case 0:
		printf("FALSE");
		break;
	case 1:
		printf("TRUE");
		break;
	default:
		printf("(invalid) TRUE");
		break;
	}
}